

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_array_toString(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue this_obj;
  JSValue this_val_00;
  JSValue JVar1;
  int iVar2;
  undefined4 in_ECX;
  int64_t in_RSI;
  JSValueUnion in_RDI;
  undefined8 in_R8;
  JSValue JVar3;
  JSValue JVar4;
  JSAtom in_stack_0000005c;
  JSValue ret;
  JSValue method;
  JSValue obj;
  BOOL in_stack_00000100;
  JSContext *in_stack_ffffffffffffff10;
  JSValue in_stack_ffffffffffffff18;
  undefined8 local_d8;
  undefined8 local_d0;
  uint in_stack_ffffffffffffff3c;
  JSContext *in_stack_ffffffffffffff40;
  JSValueUnion JVar5;
  JSValue *argv_00;
  undefined8 local_98;
  undefined8 local_90;
  JSValue *argv_01;
  int argc_00;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  undefined8 local_10;
  undefined8 local_8;
  
  argc_00 = (int)((ulong)in_R8 >> 0x20);
  JVar3.tag = in_RSI;
  JVar3.u.ptr = in_RDI.ptr;
  JVar3 = JS_ToObject((JSContext *)CONCAT44(in_ECX,in_stack_ffffffffffffffa0),JVar3);
  argv_00 = (JSValue *)JVar3.tag;
  iVar2 = JS_IsException(JVar3);
  if (iVar2 == 0) {
    JVar4 = JS_GetPropertyInternal
                      ((JSContext *)ret.u.ptr,stack0x00000078,in_stack_0000005c,
                       (JSValue)stack0x00000068,in_stack_00000100);
    local_10 = JVar4.u;
    local_8 = (JSValue *)JVar4.tag;
    JVar5 = local_10;
    argv_01 = local_8;
    iVar2 = JS_IsException(JVar4);
    if (iVar2 == 0) {
      JVar4.tag = (int64_t)argv_01;
      JVar4.u.ptr = local_10;
      iVar2 = JS_IsFunction((JSContext *)in_RDI.ptr,JVar4);
      if (iVar2 == 0) {
        JS_FreeValue(in_stack_ffffffffffffff10,in_stack_ffffffffffffff18);
        this_val_00.tag = in_RSI;
        this_val_00.u.ptr = in_RDI.ptr;
        JVar3 = js_object_toString((JSContext *)CONCAT44(in_ECX,in_stack_ffffffffffffffa0),
                                   this_val_00,argc_00,argv_00);
        local_d8 = JVar3.u;
        local_98 = local_d8;
        local_d0 = JVar3.tag;
        local_90 = local_d0;
      }
      else {
        this_obj.tag = (int64_t)local_8;
        this_obj.u.ptr = JVar5.ptr;
        in_stack_ffffffffffffff18 =
             JS_CallFree(in_stack_ffffffffffffff40,JVar3,this_obj,in_stack_ffffffffffffff3c,argv_01)
        ;
        local_98 = in_stack_ffffffffffffff18.u;
        local_90 = in_stack_ffffffffffffff18.tag;
      }
    }
    else {
      local_98 = (void *)((ulong)in_stack_ffffffffffffff3c << 0x20);
      local_90 = 6;
    }
    JS_FreeValue(in_stack_ffffffffffffff10,in_stack_ffffffffffffff18);
    local_40 = (int32_t)local_98;
    uStack_3c = local_98._4_4_;
    local_38 = local_90;
  }
  else {
    local_40 = 0;
    local_38 = 6;
  }
  JVar1.u._4_4_ = uStack_3c;
  JVar1.u.int32 = local_40;
  JVar1.tag = local_38;
  return JVar1;
}

Assistant:

static JSValue js_array_toString(JSContext *ctx, JSValueConst this_val,
                                 int argc, JSValueConst *argv)
{
    JSValue obj, method, ret;

    obj = JS_ToObject(ctx, this_val);
    if (JS_IsException(obj))
        return JS_EXCEPTION;
    method = JS_GetProperty(ctx, obj, JS_ATOM_join);
    if (JS_IsException(method)) {
        ret = JS_EXCEPTION;
    } else
    if (!JS_IsFunction(ctx, method)) {
        /* Use intrinsic Object.prototype.toString */
        JS_FreeValue(ctx, method);
        ret = js_object_toString(ctx, obj, 0, NULL);
    } else {
        ret = JS_CallFree(ctx, method, obj, 0, NULL);
    }
    JS_FreeValue(ctx, obj);
    return ret;
}